

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void CompoundFile::loadSATSector
               (istream *stream,
               vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *sat,
               int32_t sectorSize)

{
  ulong in_RAX;
  int iVar1;
  ulong uVar2;
  int32_t secID;
  SecID local_34;
  
  uVar2 = 0;
  if (0 < (int)((long)sectorSize / 4)) {
    uVar2 = (long)sectorSize / 4 & 0xffffffff;
  }
  _secID = in_RAX;
  while (iVar1 = (int)uVar2, uVar2 = (ulong)(iVar1 - 1), iVar1 != 0) {
    _secID = _secID & 0xffffffff00000000;
    readData<int>(stream,&secID,4);
    _secID = CONCAT44(secID,secID);
    std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::
    emplace_back<CompoundFile::SecID>(sat,&local_34);
  }
  return;
}

Assistant:

inline void
loadSATSector( std::istream & stream, std::vector< SecID > & sat,
	int32_t sectorSize )
{
	const int32_t secIDCount = sectorSize / 4;

	for( int32_t i = 0; i < secIDCount; ++i )
	{
		int32_t secID = 0;

		readData( stream, secID, 4 );

		sat.push_back( secID );
	}
}